

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O2

size_t pack_loc(char **buf,LocMsg *lmsg)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  size_t n;
  uint *local_20;
  
  if (lmsg->file == (char *)0x0) {
    n = 0xc;
  }
  else {
    sVar2 = strlen(lmsg->file);
    n = sVar2 + 0xc;
  }
  pcVar3 = (char *)emalloc(n);
  *buf = pcVar3;
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\x02';
  local_20 = (uint *)(pcVar3 + 4);
  pack_str((char **)&local_20,lmsg->file);
  uVar1 = lmsg->line;
  if (-1 < (int)uVar1) {
    *local_20 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    return n;
  }
  eprintf("Value of lmsg->line (%d) too big, max allowed %u\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
          ,0x135,(ulong)uVar1,0xffffffffffffffff);
}

Assistant:

static size_t pack_loc(char **buf, LocMsg * lmsg)
{
    char *ptr;
    size_t len;

    len = 4 + 4 + (lmsg->file ? strlen(lmsg->file) : 0) + 4;
    *buf = ptr = (char *)emalloc(len);

    pack_type(&ptr, CK_MSG_LOC);
    pack_str(&ptr, lmsg->file);
    if((size_t) lmsg->line > (size_t) CK_UINT32_MAX)
        eprintf("Value of lmsg->line (%d) too big, max allowed %u\n",
                __FILE__, __LINE__, lmsg->line, CK_UINT32_MAX);
    pack_int(&ptr, (ck_uint32) lmsg->line);

    return len;
}